

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlPopPE(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlEntityPtr pxVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  xmlParserInputPtr pxVar7;
  
  pxVar2 = ctxt->input->entity;
  uVar1 = pxVar2->flags;
  pxVar2->flags = uVar1 & 0xfffffff7;
  if ((uVar1 & 2) == 0) {
    do {
      ctxt->input->cur = ctxt->input->end;
      xmlParserShrink(ctxt);
      iVar4 = xmlParserGrow(ctxt);
    } while (0 < iVar4);
    pxVar7 = ctxt->input;
    uVar5 = (long)pxVar7->end - (long)pxVar7->base;
    uVar3 = 0xffffffffffffffff;
    uVar6 = uVar5 + pxVar7->consumed;
    if (CARRY8(uVar5,pxVar7->consumed)) {
      uVar6 = uVar3;
    }
    uVar5 = pxVar2->expandedSize + uVar6;
    if (CARRY8(pxVar2->expandedSize,uVar6)) {
      uVar5 = uVar3;
    }
    pxVar2->expandedSize = uVar5;
    if (pxVar2->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
      uVar5 = uVar6 + ctxt->sizeentities;
      if (CARRY8(uVar6,ctxt->sizeentities)) {
        uVar5 = uVar3;
      }
      ctxt->sizeentities = uVar5;
    }
    *(byte *)&pxVar2->flags = (byte)pxVar2->flags | 2;
  }
  pxVar7 = xmlCtxtPopInput(ctxt);
  xmlFreeInputStream(pxVar7);
  xmlParserEntityCheck(ctxt,pxVar2->expandedSize);
  pxVar7 = ctxt->input;
  if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    return;
  }
  return;
}

Assistant:

static void
xmlPopPE(xmlParserCtxtPtr ctxt) {
    unsigned long consumed;
    xmlEntityPtr ent;

    ent = ctxt->input->entity;

    ent->flags &= ~XML_ENT_EXPANDING;

    if ((ent->flags & XML_ENT_CHECKED) == 0) {
        int result;

        /*
         * Read the rest of the stream in case of errors. We want
         * to account for the whole entity size.
         */
        do {
            ctxt->input->cur = ctxt->input->end;
            xmlParserShrink(ctxt);
            result = xmlParserGrow(ctxt);
        } while (result > 0);

        consumed = ctxt->input->consumed;
        xmlSaturatedAddSizeT(&consumed,
                             ctxt->input->end - ctxt->input->base);

        xmlSaturatedAdd(&ent->expandedSize, consumed);

        /*
         * Add to sizeentities when parsing an external entity
         * for the first time.
         */
        if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
            xmlSaturatedAdd(&ctxt->sizeentities, consumed);
        }

        ent->flags |= XML_ENT_CHECKED;
    }

    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    xmlParserEntityCheck(ctxt, ent->expandedSize);

    GROW;
}